

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

QString * __thiscall
LdConfigDirWrapper::translateGuardFlagsContent
          (QString *__return_storage_ptr__,LdConfigDirWrapper *this,QString *delim)

{
  uint uVar1;
  _Base_ptr p_Var2;
  DWORD flags;
  bool isOk;
  QStringList list;
  QString flagInfo;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> flagsSet;
  
  isOk = false;
  uVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,0x18,0xffffffffffffffff,&isOk);
  if (isOk == false) {
    QString::QString(__return_storage_ptr__,"-");
  }
  else {
    getGuardFlagsSet(&flagsSet,(LdConfigDirWrapper *)(ulong)uVar1,flags);
    list.d.size = 0;
    list.d.d = (Data *)0x0;
    list.d.ptr = (QString *)0x0;
    for (p_Var2 = flagsSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &flagsSet._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      translateGuardFlag((QString *)&flagInfo.d,p_Var2[1]._M_color);
      if (flagInfo.d.size != 0) {
        QList<QString>::emplaceBack<QString_const&>(&list,(QString *)&flagInfo.d);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&flagInfo.d);
    }
    QListSpecialMethods<QString>::join
              (__return_storage_ptr__,(QListSpecialMethods<QString> *)&list,delim);
    QArrayDataPointer<QString>::~QArrayDataPointer(&list.d);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree(&flagsSet._M_t);
  }
  return __return_storage_ptr__;
}

Assistant:

QString LdConfigDirWrapper::translateGuardFlagsContent(const QString& delim)
{
    bool isOk = false;
    DWORD GuardFlags = this->getNumValue(GUARD_FLAGS, &isOk);
    if (!isOk) {
        return "-";
    }
    std::set<DWORD> flagsSet = LdConfigDirWrapper::getGuardFlagsSet(GuardFlags);
    std::set<DWORD>::iterator itr;
    QStringList list;
    for (itr = flagsSet.begin() ; itr != flagsSet.end(); ++itr) {
        const DWORD nextFlag = *itr;
        const QString flagInfo = LdConfigDirWrapper::translateGuardFlag(nextFlag);
        if (flagInfo.length() == 0) continue;
        list.append(flagInfo);
    }
    return list.join(delim);
}